

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error tt_face_vary_cvt(TT_Face face,FT_Stream stream)

{
  FT_Memory memory;
  GX_Blend blend;
  FT_Short *pFVar1;
  FT_UShort FVar2;
  FT_UShort FVar3;
  FT_Error FVar4;
  FT_ULong FVar5;
  FT_Fixed *pFVar6;
  FT_UShort *P;
  uchar *puVar7;
  FT_Fixed FVar8;
  FT_UShort *P_00;
  uchar *puVar9;
  int iVar10;
  FT_UShort *pFVar11;
  FT_UInt delta_cnt;
  long lVar12;
  FT_Fixed *pFVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  FT_Fixed *P_01;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_ULong table_len;
  FT_Error local_b4;
  FT_UShort *local_b0;
  FT_Fixed *local_a8;
  FT_Fixed *local_a0;
  FT_UShort local_92;
  ulong local_90;
  FT_UInt local_88;
  FT_UInt local_84;
  FT_UShort *local_80;
  FT_ULong local_78;
  uchar *local_70;
  uint local_64;
  FT_Fixed local_60;
  FT_UShort *local_58;
  FT_Fixed *local_50;
  ulong local_48;
  ulong local_40;
  uchar *local_38;
  
  memory = stream->memory;
  blend = face->blend;
  local_88 = 0;
  if ((((blend == (GX_Blend)0x0) || (face->cvt == (FT_Short *)0x0)) ||
      (FVar4 = (*face->goto_table)(face,0x63766172,stream,&local_78), FVar4 != 0)) ||
     (local_b4 = FT_Stream_EnterFrame(stream,local_78), local_b4 != 0)) {
    local_b4 = 0;
    pFVar6 = (FT_Fixed *)0x0;
    P = (FT_UShort *)0x0;
    pFVar13 = (FT_Fixed *)0x0;
    P_01 = (FT_Fixed *)0x0;
  }
  else {
    puVar9 = stream->cursor;
    puVar7 = stream->base;
    FVar5 = FT_Stream_GetULong(stream);
    if (FVar5 == 0x10000) {
      local_90 = (long)puVar9 - (long)puVar7;
      pFVar6 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)blend->num_axis,(void *)0x0,&local_b4);
      if (local_b4 == 0) {
        local_a8 = (FT_Fixed *)
                   ft_mem_realloc(memory,8,0,(ulong)blend->num_axis,(void *)0x0,&local_b4);
        if (local_b4 == 0) {
          P = (FT_UShort *)0x0;
          local_a0 = (FT_Fixed *)
                     ft_mem_realloc(memory,8,0,(ulong)blend->num_axis,(void *)0x0,&local_b4);
          pFVar13 = local_a8;
          P_01 = local_a0;
          if (local_b4 == 0) {
            FVar2 = FT_Stream_GetUShort(stream);
            FVar3 = FT_Stream_GetUShort(stream);
            local_48 = (ulong)(FVar2 & 0xfff);
            if (local_78 < (ulong)FVar3 + local_48 * 4) {
              local_b4 = 8;
              P = (FT_UShort *)0x0;
              pFVar13 = local_a8;
              P_01 = local_a0;
            }
            else {
              local_90 = local_90 + FVar3;
              local_50 = pFVar6;
              if ((short)FVar2 < 0) {
                puVar9 = stream->base;
                uVar16 = (long)stream->cursor - (long)puVar9;
                puVar7 = puVar9 + local_90;
                if ((ulong)((long)stream->limit - (long)puVar9) <= local_90) {
                  puVar7 = stream->limit;
                }
                stream->cursor = puVar7;
                P = ft_var_readpackedpoints(stream,local_78,&local_88);
                puVar9 = stream->base;
                local_90 = (long)stream->cursor - (long)puVar9;
                puVar7 = puVar9 + uVar16;
                if ((ulong)((long)stream->limit - (long)puVar9) <= uVar16) {
                  puVar7 = stream->limit;
                }
                stream->cursor = puVar7;
              }
              else {
                P = (FT_UShort *)0x0;
              }
              pFVar13 = local_a8;
              pFVar6 = local_50;
              P_01 = local_a0;
              if ((uint)local_48 != 0) {
                uVar16 = 0;
                local_80 = (FT_UShort *)0x0;
                local_58 = P;
                do {
                  local_40 = uVar16;
                  local_92 = FT_Stream_GetUShort(stream);
                  FVar2 = FT_Stream_GetUShort(stream);
                  local_b0 = (FT_UShort *)CONCAT44(local_b0._4_4_,(uint)FVar2);
                  if ((short)FVar2 < 0) {
                    if (blend->num_axis != 0) {
                      uVar16 = 0;
                      do {
                        FVar2 = FT_Stream_GetUShort(stream);
                        pFVar6[uVar16] = (long)((int)(short)FVar2 << 2);
                        uVar16 = uVar16 + 1;
                      } while (uVar16 < blend->num_axis);
                    }
                  }
                  else {
                    uVar14 = FVar2 & 0xfff;
                    if (blend->tuplecount <= uVar14) {
                      local_b4 = 8;
                      pFVar13 = local_a8;
                      P_01 = local_a0;
                      goto LAB_0016d9e2;
                    }
                    memcpy(pFVar6,blend->tuplecoords + uVar14 * blend->num_axis,
                           (ulong)blend->num_axis << 3);
                  }
                  pFVar6 = local_a8;
                  pFVar13 = local_a0;
                  if ((((uint)local_b0 >> 0xe & 1) != 0) && (blend->num_axis != 0)) {
                    uVar16 = 0;
                    do {
                      FVar2 = FT_Stream_GetUShort(stream);
                      pFVar13 = local_a0;
                      pFVar6[uVar16] = (long)((int)(short)FVar2 << 2);
                      uVar16 = uVar16 + 1;
                    } while (uVar16 < blend->num_axis);
                    if (blend->num_axis != 0) {
                      uVar16 = 0;
                      do {
                        FVar2 = FT_Stream_GetUShort(stream);
                        pFVar13[uVar16] = (long)((int)(short)FVar2 << 2);
                        uVar16 = uVar16 + 1;
                      } while (uVar16 < blend->num_axis);
                    }
                  }
                  pFVar6 = local_50;
                  uVar14 = (uint)local_b0;
                  FVar8 = ft_var_apply_tuple(blend,(FT_UShort)local_b0,local_50,local_a8,pFVar13);
                  P = local_58;
                  if (FVar8 == 0) {
                    iVar10 = (int)local_40;
                  }
                  else {
                    local_38 = stream->base;
                    local_70 = stream->cursor;
                    puVar9 = local_38 + local_90;
                    if ((ulong)((long)stream->limit - (long)local_38) <= local_90) {
                      puVar9 = stream->limit;
                    }
                    stream->cursor = puVar9;
                    local_60 = FVar8;
                    if ((uVar14 >> 0xd & 1) == 0) {
                      local_84 = local_88;
                      local_b0 = local_58;
                    }
                    else {
                      local_b0 = ft_var_readpackedpoints(stream,local_78,&local_84);
                      local_80 = local_b0;
                    }
                    delta_cnt = local_84;
                    if (local_84 == 0) {
                      delta_cnt = (FT_UInt)face->cvt_size;
                    }
                    local_64 = local_84;
                    P_00 = (FT_UShort *)ft_var_readpackeddeltas(stream,local_78,delta_cnt);
                    if ((local_b0 == (FT_UShort *)0x0) || (P_00 == (FT_UShort *)0x0)) {
LAB_0016d941:
                      if (local_80 == (FT_UShort *)0xffffffffffffffff) {
                        pFVar11 = (FT_UShort *)0xffffffffffffffff;
                      }
                      else {
LAB_0016d94c:
                        local_b0 = P_00;
                        ft_mem_free(memory,local_80);
                        pFVar11 = (FT_UShort *)0x0;
                        P_00 = local_b0;
                      }
                    }
                    else {
                      if (local_80 != (FT_UShort *)0xffffffffffffffff) {
                        if (local_64 != 0) {
                          uVar16 = face->cvt_size;
                          uVar15 = 0;
                          do {
                            if (local_b0[uVar15] < uVar16) {
                              face->cvt[local_b0[uVar15]] =
                                   face->cvt[local_b0[uVar15]] +
                                   (short)((uint)((int)((long)((FT_Short *)P_00)[uVar15] *
                                                       (long)(int)local_60) +
                                                  (int)((long)((FT_Short *)P_00)[uVar15] *
                                                        (long)(int)local_60 >> 0x3f) + 0x8000) >>
                                          0x10);
                            }
                            uVar15 = uVar15 + 1;
                          } while (local_64 != uVar15);
                          goto LAB_0016d941;
                        }
                        goto LAB_0016d94c;
                      }
                      pFVar11 = (FT_UShort *)0xffffffffffffffff;
                      if (local_64 != 0 && face->cvt_size == (ulong)local_64) {
                        pFVar1 = face->cvt;
                        lVar12 = 0;
                        do {
                          pFVar1[lVar12] =
                               pFVar1[lVar12] +
                               (short)((uint)((int)((long)((FT_Short *)P_00)[lVar12] *
                                                   (long)(int)local_60) +
                                              (int)((long)((FT_Short *)P_00)[lVar12] *
                                                    (long)(int)local_60 >> 0x3f) + 0x8000) >> 0x10);
                          lVar12 = lVar12 + 1;
                        } while ((uint)lVar12 < local_64);
                        goto LAB_0016d941;
                      }
                    }
                    local_70 = (uchar *)((long)local_70 - (long)local_38);
                    local_b0 = pFVar11;
                    ft_mem_free(memory,P_00);
                    puVar9 = stream->base + (long)local_70;
                    if ((ulong)((long)stream->limit - (long)stream->base) <= local_70) {
                      puVar9 = stream->limit;
                    }
                    stream->cursor = puVar9;
                    local_80 = local_b0;
                    iVar10 = (int)local_40;
                  }
                  local_90 = local_90 + local_92;
                  uVar16 = (ulong)(iVar10 + 1U);
                  pFVar13 = local_a8;
                  P_01 = local_a0;
                } while (iVar10 + 1U != (uint)local_48);
              }
            }
          }
        }
        else {
          P = (FT_UShort *)0x0;
          pFVar13 = local_a8;
          P_01 = (FT_Fixed *)0x0;
        }
      }
      else {
        P = (FT_UShort *)0x0;
        pFVar13 = (FT_Fixed *)0x0;
        P_01 = (FT_Fixed *)0x0;
      }
    }
    else {
      local_b4 = 0;
      P = (FT_UShort *)0x0;
      pFVar13 = (FT_Fixed *)0x0;
      pFVar6 = (FT_Fixed *)0x0;
      P_01 = (FT_Fixed *)0x0;
    }
    FT_Stream_ExitFrame(stream);
LAB_0016d9e2:
    if (P == (FT_UShort *)0xffffffffffffffff) goto LAB_0016d4ed;
  }
  ft_mem_free(memory,P);
LAB_0016d4ed:
  ft_mem_free(memory,pFVar6);
  ft_mem_free(memory,pFVar13);
  ft_mem_free(memory,P_01);
  return local_b4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_vary_cvt( TT_Face    face,
                    FT_Stream  stream )
  {
    FT_Error    error;
    FT_Memory   memory = stream->memory;
    FT_ULong    table_start;
    FT_ULong    table_len;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    GX_Blend    blend           = face->blend;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short*   deltas;


    FT_TRACE2(( "CVAR " ));

    if ( !blend )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no blend specified\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    if ( !face->cvt )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no `cvt ' table\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    error = face->goto_table( face, TTAG_cvar, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));

      error = FT_Err_Ok;
      goto Exit;
    }

    if ( FT_FRAME_ENTER( table_len ) )
    {
      error = FT_Err_Ok;
      goto Exit;
    }

    table_start = FT_Stream_FTell( stream );
    if ( FT_GET_LONG() != 0x00010000L )
    {
      FT_TRACE2(( "bad table version\n" ));

      error = FT_Err_Ok;
      goto FExit;
    }

    FT_TRACE2(( "loaded\n" ));

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto FExit;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           table_len )
    {
      FT_TRACE2(( "tt_face_vary_cvt:"
                  " invalid CVT variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto FExit;
    }

    offsetToData += table_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              table_len,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "cvar: there %s %d tuple%s:\n",
                ( tupleCount & 0xFFF ) == 1 ? "is" : "are",
                tupleCount & 0xFFF,
                ( tupleCount & 0xFFF ) == 1 ? "" : "s" ));

    for ( i = 0; i < ( tupleCount & 0xFFF ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;  /* convert from        */
                                                 /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "tt_face_vary_cvt:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Exit;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               table_len,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas = ft_var_readpackeddeltas( stream,
                                        table_len,
                                        point_count == 0 ? face->cvt_size
                                                         : point_count );

      if ( !points                                                        ||
           !deltas                                                        ||
           ( localpoints == ALL_POINTS && point_count != face->cvt_size ) )
        ; /* failure, ignore it */

      else if ( localpoints == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        /* this means that there are deltas for every entry in cvt */
        for ( j = 0; j < face->cvt_size; j++ )
        {
          FT_Long  orig_cvt = face->cvt[j];


          face->cvt[j] = (FT_Short)( orig_cvt +
                                     FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[j] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        j, orig_cvt, face->cvt[j] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        for ( j = 0; j < point_count; j++ )
        {
          int      pindex;
          FT_Long  orig_cvt;


          pindex = points[j];
          if ( (FT_ULong)pindex >= face->cvt_size )
            continue;

          orig_cvt          = face->cvt[pindex];
          face->cvt[pindex] = (FT_Short)( orig_cvt +
                                          FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[pindex] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        pindex, orig_cvt, face->cvt[pindex] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  FExit:
    FT_FRAME_EXIT();

  Exit:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    return error;
  }